

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O0

size_t __thiscall axl::err::Error::createSimpleError(Error *this,Guid *guid,uint_t code)

{
  long lVar1;
  undefined4 in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  bool in_stack_0000004f;
  size_t in_stack_00000050;
  Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef> *in_stack_00000058;
  size_t local_8;
  
  rc::Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>::createBuffer
            (in_stack_00000058,in_stack_00000050,in_stack_0000004f);
  if (*in_RDI == 0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    *(undefined4 *)*in_RDI = 0x18;
    lVar1 = *in_RDI;
    *(undefined8 *)(lVar1 + 4) = *in_RSI;
    *(undefined8 *)(lVar1 + 0xc) = in_RSI[1];
    *(undefined4 *)(*in_RDI + 0x14) = in_EDX;
    local_8 = 0x18;
  }
  return local_8;
}

Assistant:

size_t
Error::createSimpleError(
	const sl::Guid& guid,
	uint_t code
) {
	createBuffer(sizeof(ErrorHdr));
	if (!m_p)
		return -1;

	m_p->m_size = sizeof(ErrorHdr);
	m_p->m_guid = guid;
	m_p->m_code = code;
	return sizeof(ErrorHdr);
}